

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

bool __thiscall
SoftHSM::isMechanismPermitted(SoftHSM *this,OSObject *key,CK_MECHANISM_PTR pMechanism)

{
  _List_iterator<unsigned_long> _Var1;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *__x;
  iterator iVar2;
  bool bVar3;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> allowed;
  list<unsigned_long,_std::allocator<unsigned_long>_> mechs;
  OSAttribute attribute;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_100;
  _List_base<unsigned_long,_std::allocator<unsigned_long>_> local_d0;
  OSAttribute local_b8;
  
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d0,
             &this->supportedMechanisms);
  _Var1 = std::
          __find_if<std::_List_iterator<unsigned_long>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                    (local_d0._M_impl._M_node.super__List_node_base._M_next,
                     (_List_node_base *)&local_d0,pMechanism);
  if (_Var1._M_node == (_List_node_base *)&local_d0) {
    bVar3 = false;
  }
  else {
    (*key->_vptr_OSObject[3])(&local_b8,key,0x40000600);
    __x = &OSAttribute::getMechanismTypeSetValue(&local_b8)->_M_t;
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::_Rb_tree(&local_100,__x);
    if (local_100._M_impl.super__Rb_tree_header._M_node_count == 0) {
      bVar3 = true;
    }
    else {
      iVar2 = std::
              _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
              ::find(&local_100,&pMechanism->mechanism);
      bVar3 = (_Rb_tree_header *)iVar2._M_node != &local_100._M_impl.super__Rb_tree_header;
    }
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree(&local_100);
    OSAttribute::~OSAttribute(&local_b8);
  }
  std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear(&local_d0);
  return bVar3;
}

Assistant:

bool SoftHSM::isMechanismPermitted(OSObject* key, CK_MECHANISM_PTR pMechanism)
{
	std::list<CK_MECHANISM_TYPE> mechs = supportedMechanisms;
	/* First check if the algorithm is enabled in the global configuration */
	auto it = std::find(mechs.begin(), mechs.end(), pMechanism->mechanism);
	if (it == mechs.end())
		return false;

	OSAttribute attribute = key->getAttribute(CKA_ALLOWED_MECHANISMS);
	std::set<CK_MECHANISM_TYPE> allowed = attribute.getMechanismTypeSetValue();

	if (allowed.empty()) {
		return true;
	}

	return allowed.find(pMechanism->mechanism) != allowed.end();
}